

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,IStringFromParts *parts)

{
  ValueLength *pVVar1;
  ValueLength VVar2;
  ulong v;
  long lVar3;
  size_t __n;
  long lVar4;
  undefined1 auVar5 [16];
  
  VVar2 = this->_pos;
  checkKeyHasValidType(this,true);
  v = (**(code **)(*(long *)parts + 0x18))(parts);
  if (v < 0x7f) {
    reserve(this,v + 1);
    appendByteUnchecked(this,(char)v + '@');
  }
  else {
    reserve(this,v + 9);
    appendByteUnchecked(this,0xbf);
    appendLengthUnchecked<8ul>(this,v);
  }
  lVar3 = (**(code **)(*(long *)parts + 0x10))(parts);
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    auVar5 = (**(code **)(*(long *)parts + 0x20))(parts,lVar4);
    __n = auVar5._0_8_;
    if (__n != 0) {
      memcpy(this->_start + this->_pos,auVar5._8_8_,__n);
      this->_pos = this->_pos + __n;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + __n;
    }
  }
  return this->_start + VVar2;
}

Assistant:

uint8_t* Builder::set(IStringFromParts const& parts) {
  // This method builds a single VPack String item composed of the 2 parts.
  auto const oldPos = _pos;

  checkKeyHasValidType(true);

  uint64_t length = parts.totalLength();
  if (length > 126) {
    // long string
    reserve(1 + 8 + length);
    appendByteUnchecked(0xbf);
    appendLengthUnchecked<8>(length);
  } else {
    // short string
    reserve(1 + length);
    appendByteUnchecked(static_cast<uint8_t>(0x40 + length));
  }
  for (std::size_t idx = 0, size = parts.numberOfParts(); idx != size; ++idx) {
    auto part = parts(idx);
    if (part.size() != 0) {
      std::memcpy(_start + _pos, part.data(), checkOverflow(part.size()));
      advance(part.size());
    }
  }
  return _start + oldPos;
}